

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b35295::DumpVisitor::onStartDIE(DumpVisitor *this,Unit *CU,Entry *DIE)

{
  llvm::encodeULEB128((ulong)(DIE->AbbrCode).value,this->OS,0);
  return;
}

Assistant:

void onStartDIE(const DWARFYAML::Unit &CU,
                  const DWARFYAML::Entry &DIE) override {
    encodeULEB128(DIE.AbbrCode, OS);
  }